

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError file2memory(char **bufp,size_t *size,FILE *file)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *__ptr;
  
  pcVar2 = (char *)0x0;
  if (file == (FILE *)0x0) {
    sVar5 = 0;
    goto LAB_001193cb;
  }
  sVar4 = 0x200;
  sVar5 = 0;
  __ptr = (char *)0x0;
  do {
    pcVar2 = __ptr;
    if (sVar4 == sVar5 || __ptr == (char *)0x0) {
      if (((long)(sVar4 + 1) < 0) ||
         (pcVar2 = (char *)realloc(__ptr,sVar4 * 2 + 1), pcVar2 == (char *)0x0)) goto LAB_001193b5;
      sVar4 = sVar4 * 2;
    }
    sVar3 = fread(pcVar2 + sVar5,1,sVar4 - sVar5,(FILE *)file);
    sVar5 = sVar5 + sVar3;
    __ptr = pcVar2;
  } while (sVar3 != 0);
  pcVar2[sVar5] = '\0';
  if ((sVar4 == sVar5) || (pcVar2 = (char *)realloc(pcVar2,sVar5 + 1), pcVar2 != (char *)0x0)) {
    bVar1 = true;
    if (sVar5 == 0) goto LAB_001193b7;
  }
  else {
LAB_001193b5:
    pcVar2 = __ptr;
    bVar1 = false;
LAB_001193b7:
    free(pcVar2);
    pcVar2 = (char *)0x0;
  }
  if (!bVar1) {
    return PARAM_NO_MEM;
  }
LAB_001193cb:
  *size = sVar5;
  *bufp = pcVar2;
  return PARAM_OK;
}

Assistant:

ParameterError file2memory(char **bufp, size_t *size, FILE *file)
{
  char *newbuf;
  char *buffer = NULL;
  size_t nused = 0;

  if(file) {
    size_t nread;
    size_t alloc = 512;
    do {
      if(!buffer || (alloc == nused)) {
        /* size_t overflow detection for huge files */
        if(alloc + 1 > ((size_t)-1)/2) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        alloc *= 2;
        /* allocate an extra char, reserved space, for null termination */
        newbuf = realloc(buffer, alloc + 1);
        if(!newbuf) {
          Curl_safefree(buffer);
          return PARAM_NO_MEM;
        }
        buffer = newbuf;
      }
      nread = fread(buffer + nused, 1, alloc-nused, file);
      nused += nread;
    } while(nread);
    /* null terminate the buffer in case it's used as a string later */
    buffer[nused] = '\0';
    /* free trailing slack space, if possible */
    if(alloc != nused) {
      newbuf = realloc(buffer, nused + 1);
      if(!newbuf) {
        Curl_safefree(buffer);
        return PARAM_NO_MEM;
      }
      buffer = newbuf;
    }
    /* discard buffer if nothing was read */
    if(!nused) {
      Curl_safefree(buffer); /* no string */
    }
  }
  *size = nused;
  *bufp = buffer;
  return PARAM_OK;
}